

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name)

{
  pointer file_00;
  bool bVar1;
  Type TVar2;
  size_type sVar3;
  DescriptorBuilder *pDVar4;
  ulong uVar6;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar7;
  Symbol SVar8;
  FileDescriptor *file;
  Symbol result;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar5;
  
  SVar8 = FindSymbolNotEnforcingDeps(this,name);
  aVar5 = SVar8.field_1;
  TVar2 = SVar8.type;
  if (TVar2 == NULL_SYMBOL) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)TVar2;
    if (this->pool_->enforce_dependencies_ == true) {
      result.type = TVar2;
      result.field_1 = aVar5;
      file = anon_unknown_1::Symbol::GetFile(&result);
      if (file != this->file_) {
        this_00 = (DescriptorBuilder *)&this->dependencies_;
        sVar3 = std::
                set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::count((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         *)this_00,&file);
        if (sVar3 == 0) {
          if (TVar2 == PACKAGE) {
            bVar1 = IsInPackage(this_00,this->file_,name);
            uVar6 = 7;
            if (bVar1) goto LAB_001e9400;
            pDVar7 = (DescriptorBuilder *)
                     (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            while (pDVar7 != (DescriptorBuilder *)
                             &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header) {
              file_00 = (pDVar7->options_to_interpret_).
                        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (file_00 != (pointer)0x0) {
                bVar1 = IsInPackage(this_00,(FileDescriptor *)file_00,name);
                if (bVar1) goto LAB_001e9400;
              }
              pDVar4 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar7);
              this_00 = pDVar7;
              pDVar7 = pDVar4;
            }
          }
          this->possible_undeclared_dependency_ = file;
          std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
          uVar6 = (ulong)(anonymous_namespace)::kNullSymbol;
          aVar5 = DAT_0029a628;
        }
      }
    }
  }
LAB_001e9400:
  SVar8.field_1.descriptor = aVar5.descriptor;
  SVar8._0_8_ = uVar6;
  return SVar8;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const string& name) {
  Symbol result = FindSymbolNotEnforcingDeps(name);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader.
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) return result;

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (set<const FileDescriptor*>::const_iterator it = dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be NULL if it was not found or had errors.
      if (*it != NULL && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}